

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O0

Expression * __thiscall CFG::LoopShape::Render(LoopShape *this,RelooperBuilder *Builder,bool InLoop)

{
  Shape *pSVar1;
  RelooperBuilder *this_00;
  int iVar2;
  undefined4 extraout_var;
  Block *left;
  undefined4 extraout_var_00;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  optional<wasm::Type> local_60;
  optional<wasm::Type> local_48;
  string_view local_38;
  Block *local_28;
  Expression *Ret;
  RelooperBuilder *pRStack_18;
  bool InLoop_local;
  RelooperBuilder *Builder_local;
  LoopShape *this_local;
  
  Ret._7_1_ = InLoop;
  pRStack_18 = Builder;
  Builder_local = (RelooperBuilder *)this;
  local_38 = (string_view)RelooperBuilder::getShapeContinueName(Builder,(this->super_Shape).Id);
  iVar2 = (*this->Inner->_vptr_Shape[2])(this->Inner,pRStack_18,1);
  std::optional<wasm::Type>::optional(&local_48);
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_7_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       local_48.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_payload;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged =
       local_48.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_engaged;
  local_28 = (Block *)::wasm::Builder::makeLoop
                                (&Builder->super_Builder,(Name)local_38,
                                 (Expression *)CONCAT44(extraout_var,iVar2),type_00);
  left = (Block *)HandleFollowupMultiples
                            ((Expression *)local_28,&this->super_Shape,pRStack_18,
                             (bool)(Ret._7_1_ & 1));
  this_00 = pRStack_18;
  local_28 = left;
  if ((this->super_Shape).Next != (Shape *)0x0) {
    pSVar1 = (this->super_Shape).Next;
    iVar2 = (*pSVar1->_vptr_Shape[2])(pSVar1,pRStack_18,(ulong)Ret._7_1_ & 1);
    std::optional<wasm::Type>::optional(&local_60);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_60.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_60.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    local_28 = ::wasm::Builder::makeSequence
                         (&this_00->super_Builder,(Expression *)left,
                          (Expression *)CONCAT44(extraout_var_00,iVar2),type);
  }
  return (Expression *)local_28;
}

Assistant:

wasm::Expression* LoopShape::Render(RelooperBuilder& Builder, bool InLoop) {
  wasm::Expression* Ret = Builder.makeLoop(Builder.getShapeContinueName(Id),
                                           Inner->Render(Builder, true));
  Ret = HandleFollowupMultiples(Ret, this, Builder, InLoop);
  if (Next) {
    Ret = Builder.makeSequence(Ret, Next->Render(Builder, InLoop));
  }
  return Ret;
}